

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O2

void __thiscall QToolButton::enterEvent(QToolButton *this,QEnterEvent *e)

{
  long lVar1;
  QAction *this_00;
  
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if ((*(byte *)(lVar1 + 0x2ec) & 8) != 0) {
    QWidget::update((QWidget *)this);
  }
  this_00 = *(QAction **)(lVar1 + 0x2f0);
  if (this_00 != (QAction *)0x0) {
    QAction::hover(this_00);
  }
  QWidget::enterEvent((QWidget *)this,e);
  return;
}

Assistant:

void QToolButton::enterEvent(QEnterEvent * e)
{
    Q_D(QToolButton);
    if (d->autoRaise)
        update();
    if (d->defaultAction)
        d->defaultAction->hover();
    QAbstractButton::enterEvent(e);
}